

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

char * xmlURIUnescapeString(char *str,int len,char *target)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcStack_40;
  int c;
  char *in;
  char *out;
  char *ret;
  char *target_local;
  int len_local;
  char *str_local;
  
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    target_local._4_4_ = len;
    if (len < 1) {
      sVar3 = strlen(str);
      target_local._4_4_ = (int)sVar3;
    }
    if (target_local._4_4_ < 0) {
      str_local = (char *)0x0;
    }
    else {
      out = target;
      if ((target == (char *)0x0) &&
         (out = (char *)(*xmlMalloc)((long)(target_local._4_4_ + 1)), out == (char *)0x0)) {
        str_local = (char *)0x0;
      }
      else {
        in = out;
        pcStack_40 = str;
        while (0 < target_local._4_4_) {
          if ((((target_local._4_4_ < 3) || (*pcStack_40 != '%')) ||
              (iVar2 = is_hex(pcStack_40[1]), iVar2 == 0)) ||
             (iVar2 = is_hex(pcStack_40[2]), iVar2 == 0)) {
            *in = *pcStack_40;
            target_local._4_4_ = target_local._4_4_ + -1;
            pcStack_40 = pcStack_40 + 1;
          }
          else {
            cVar1 = '\0';
            pcVar4 = pcStack_40 + 1;
            if ((*pcVar4 < '0') || ('9' < *pcVar4)) {
              if ((*pcVar4 < 'a') || ('f' < *pcVar4)) {
                if (('@' < *pcVar4) && (*pcVar4 < 'G')) {
                  cVar1 = *pcVar4 + -0x37;
                }
              }
              else {
                cVar1 = *pcVar4 + -0x57;
              }
            }
            else {
              cVar1 = *pcVar4 + -0x30;
            }
            pcVar4 = pcStack_40 + 2;
            if ((*pcVar4 < '0') || ('9' < *pcVar4)) {
              if ((*pcVar4 < 'a') || ('f' < *pcVar4)) {
                if (('@' < *pcVar4) && (*pcVar4 < 'G')) {
                  cVar1 = cVar1 * '\x10' + *pcVar4 + -0x37;
                }
              }
              else {
                cVar1 = cVar1 * '\x10' + *pcVar4 + -0x57;
              }
            }
            else {
              cVar1 = cVar1 * '\x10' + *pcVar4 + -0x30;
            }
            target_local._4_4_ = target_local._4_4_ + -3;
            *in = cVar1;
            pcStack_40 = pcStack_40 + 3;
          }
          in = in + 1;
        }
        *in = '\0';
        str_local = out;
      }
    }
  }
  return str_local;
}

Assistant:

char *
xmlURIUnescapeString(const char *str, int len, char *target) {
    char *ret, *out;
    const char *in;

    if (str == NULL)
	return(NULL);
    if (len <= 0) len = strlen(str);
    if (len < 0) return(NULL);

    if (target == NULL) {
	ret = xmlMalloc(len + 1);
	if (ret == NULL)
	    return(NULL);
    } else
	ret = target;
    in = str;
    out = ret;
    while(len > 0) {
	if ((len > 2) && (*in == '%') && (is_hex(in[1])) && (is_hex(in[2]))) {
            int c = 0;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        c = (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        c = (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        c = (*in - 'A') + 10;
	    in++;
	    if ((*in >= '0') && (*in <= '9'))
	        c = c * 16 + (*in - '0');
	    else if ((*in >= 'a') && (*in <= 'f'))
	        c = c * 16 + (*in - 'a') + 10;
	    else if ((*in >= 'A') && (*in <= 'F'))
	        c = c * 16 + (*in - 'A') + 10;
	    in++;
	    len -= 3;
            /* Explicit sign change */
	    *out++ = (char) c;
	} else {
	    *out++ = *in++;
	    len--;
	}
    }
    *out = 0;
    return(ret);
}